

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O0

int RDL_cmp_cycles(void *vc1,void *vc2)

{
  long lVar1;
  char *c2;
  char *c1;
  uint i;
  uint len2;
  uint len1;
  uint first_difference;
  void *vc2_local;
  void *vc1_local;
  
  len2 = 0;
  i = 0;
  c1._4_4_ = 0;
  c1._0_4_ = 0;
  lVar1 = *vc1;
  for (; *(char *)(lVar1 + (ulong)(uint)c1) != '\x02'; c1._0_4_ = (uint)c1 + 1) {
    if (((*(char *)(lVar1 + (ulong)(uint)c1) != '\0') &&
        (i = i + 1, *(char *)(*vc2 + (ulong)(uint)c1) == '\0')) && (len2 == 0)) {
      len2 = 1;
    }
    if (((*(char *)(*vc2 + (ulong)(uint)c1) != '\0') &&
        (c1._4_4_ = c1._4_4_ + 1, *(char *)(lVar1 + (ulong)(uint)c1) == '\0')) && (len2 == 0)) {
      len2 = 2;
    }
  }
  if (i < c1._4_4_) {
    return -1;
  }
  if (i == c1._4_4_) {
    if (len2 == 1) {
      return -1;
    }
    if (len2 == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int RDL_cmp_cycles(const void* vc1, const void* vc2)
{
  unsigned first_difference = 0;
  unsigned len1 = 0;
  unsigned len2 = 0;
  unsigned i = 0;

  const char* c1 = *((const char**) vc1);
  const char* c2 = *((const char**) vc2);

  while (c1[i] != 2) {
    if (c1[i]) {
      ++len1;
      if (!c2[i] && !first_difference) {
        first_difference = 1;
      }
    }
    if (c2[i]) {
      ++len2;
      if (!c1[i] && !first_difference) {
        first_difference = 2;
      }
    }
    ++i;
  }

  if (len1 < len2) {
    return -1;
  }
  else if (len1 == len2) {
    if (first_difference == 1) {
      return -1;
    }
    else if (first_difference == 0) {
      return 0;
    }
  }

  return 1;
}